

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FSAOHDist_NECOF.cpp
# Opt level: O1

string * __thiscall
FSAOHDist_NECOF::SoftPrint_abi_cxx11_(string *__return_storage_ptr__,FSAOHDist_NECOF *this)

{
  pointer pvVar1;
  double *pdVar2;
  bool bVar3;
  string *psVar4;
  ostream *poVar5;
  pointer ppCVar6;
  ulong uVar7;
  pointer pvVar8;
  ulong uVar9;
  double *pdVar10;
  stringstream ss;
  stringstream ss_1;
  stringstream ss_2;
  long *local_6e8;
  long local_6e0;
  long local_6d8 [2];
  long *local_6c8;
  long local_6c0;
  long local_6b8 [2];
  ostream *local_6a8;
  string *local_6a0;
  pointer local_698;
  long *local_690;
  long local_688;
  long local_680 [2];
  long *local_670;
  long local_668;
  long local_660 [2];
  stringstream local_650 [16];
  long local_640 [14];
  ios_base local_5d0 [264];
  long *local_4c8;
  long local_4c0;
  long local_4b8 [14];
  ios_base local_448 [264];
  stringstream local_340 [16];
  ostream local_330 [112];
  ios_base local_2c0 [264];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base aiStack_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_650);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_640,"Nearly completely factored (S,OH)-distribution:",0x2f);
  std::ios::widen((char)*(undefined8 *)(local_640[0] + -0x18) + (char)local_640);
  std::ostream::put((char)local_640);
  poVar5 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"state factor marginals=",0x17);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  (*(this->_m_sfacMarginals->super_FactoredStateDistribution).super_StateDistribution.
    _vptr_StateDistribution[6])(&local_670);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_640,(char *)local_670,local_668);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"oHist marginals=",0x10);
  std::__cxx11::stringstream::stringstream(local_340);
  pvVar8 = (this->_m_oHistMarginals).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (this->_m_oHistMarginals).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_6a8 = poVar5;
  local_6a0 = __return_storage_ptr__;
  std::__ostream_insert<char,std::char_traits<char>>(local_330,"< ",2);
  if (pvVar8 != pvVar1) {
    local_698 = pvVar1;
    do {
      if (pvVar8 != (this->_m_oHistMarginals).
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) {
        std::__ostream_insert<char,std::char_traits<char>>(local_330,", ",2);
      }
      std::__cxx11::stringstream::stringstream(local_1b8);
      pdVar10 = (pvVar8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pdVar2 = (pvVar8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"< ",2);
      for (; pdVar10 != pdVar2; pdVar10 = pdVar10 + 1) {
        if (pdVar10 !=
            (pvVar8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start) {
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", ",2);
        }
        std::__cxx11::stringstream::stringstream((stringstream *)&local_4c8);
        std::ostream::_M_insert<double>(*pdVar10);
        std::__cxx11::stringbuf::str();
        std::__cxx11::stringstream::~stringstream((stringstream *)&local_4c8);
        std::ios_base::~ios_base(local_448);
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_6c8,local_6c0);
        if (local_6c8 != local_6b8) {
          operator_delete(local_6c8,local_6b8[0] + 1);
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8," >",2);
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base(aiStack_138);
      std::__ostream_insert<char,std::char_traits<char>>(local_330,(char *)local_6e8,local_6e0);
      pvVar1 = local_698;
      if (local_6e8 != local_6d8) {
        operator_delete(local_6e8,local_6d8[0] + 1);
      }
      pvVar8 = pvVar8 + 1;
    } while (pvVar8 != pvVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_330," >",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_340);
  std::ios_base::~ios_base(local_2c0);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(local_6a8,(char *)local_690,local_688)
  ;
  psVar4 = local_6a0;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if (local_690 != local_680) {
    operator_delete(local_690,local_680[0] + 1);
  }
  if (local_670 != local_660) {
    operator_delete(local_670,local_660[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_640,"oHist conditionals=",0x13);
  std::ios::widen((char)*(undefined8 *)(local_640[0] + -0x18) + (char)local_640);
  std::ostream::put((char)local_640);
  std::ostream::flush();
  ppCVar6 = (this->_m_oHistConditional).
            super__Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->_m_oHistConditional).
      super__Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppCVar6) {
    uVar7 = 0;
    uVar9 = 1;
    do {
      (*ppCVar6[uVar7]->_vptr_CPDDiscreteInterface[7])(&local_4c8);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_640,(char *)local_4c8,local_4c0);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      if (local_4c8 != local_4b8) {
        operator_delete(local_4c8,local_4b8[0] + 1);
      }
      ppCVar6 = (this->_m_oHistConditional).
                super__Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      bVar3 = uVar9 < (ulong)((long)(this->_m_oHistConditional).
                                    super__Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar6 >> 3)
      ;
      uVar7 = uVar9;
      uVar9 = (ulong)((int)uVar9 + 1);
    } while (bVar3);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_650);
  std::ios_base::~ios_base(local_5d0);
  return psVar4;
}

Assistant:

string FSAOHDist_NECOF::SoftPrint() const
{
    stringstream ss;
    ss << "Nearly completely factored (S,OH)-distribution:"<<endl
        << "state factor marginals="<<endl;
    ss << _m_sfacMarginals->SoftPrint() 
       << "oHist marginals="<< SoftPrintVector(_m_oHistMarginals) << endl;
    ss << "oHist conditionals=" << endl;
//     <<     "Not printed"<< endl <<
    for(Index agI=0; agI < _m_oHistConditional.size(); agI++)        
        ss <<  _m_oHistConditional.at(agI)->SoftPrint() << endl;
    return (ss.str() );

}